

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpconv.c
# Opt level: O1

void fpconv_init(void)

{
  char *pcVar1;
  void *pvVar2;
  int iVar3;
  long *__s;
  size_t __size;
  char buf [8];
  char local_10;
  char local_f;
  char local_e;
  char local_d;
  
  __s = (long *)&local_10;
  iVar3 = 8;
  snprintf((char *)__s,8,"%g",0x3fe0000000000000);
  if (((local_10 == '0') && (local_e == '5')) && (local_d == '\0')) {
    locale_decimal_point = local_f;
    return;
  }
  fpconv_init_cold_1();
  __size = 0x3ff;
  if (0 < iVar3) {
    __size = (size_t)(iVar3 + 1);
  }
  *__s = 0;
  *(int *)(__s + 1) = (int)__size;
  pcVar1 = (char *)((long)__s + 0xc);
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = -2;
  pcVar1[5] = -1;
  pcVar1[6] = -1;
  pcVar1[7] = -1;
  pcVar1 = (char *)((long)__s + 0x14);
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  pcVar1 = (char *)((long)__s + 0x1c);
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pvVar2 = malloc(__size);
  *__s = (long)pvVar2;
  if (pvVar2 != (void *)0x0) {
    *(undefined1 *)(*__s + (long)*(int *)((long)__s + 0xc)) = 0;
    return;
  }
  die("Out of memory");
}

Assistant:

static void fpconv_update_locale()
{
    char buf[8];

    snprintf(buf, sizeof(buf), "%g", 0.5);

    /* Failing this test might imply the platform has a buggy dtoa
     * implementation or wide characters */
    if (buf[0] != '0' || buf[2] != '5' || buf[3] != 0) {
        fprintf(stderr, "Error: wide characters found or printf() bug.");
        abort();
    }

    locale_decimal_point = buf[1];
}